

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O0

void __thiscall CUI::UpdateClipping(CUI *this)

{
  bool bVar1;
  int iVar2;
  CUIRect *pCVar3;
  CUIRect *pCVar4;
  IGraphics *pIVar5;
  CUI *in_RDI;
  float fVar6;
  float fVar7;
  float YScale;
  float XScale;
  CUIRect *pRect;
  
  bVar1 = IsClipped(in_RDI);
  if (bVar1) {
    pCVar3 = ClipArea(in_RDI);
    pIVar5 = Graphics(in_RDI);
    iVar2 = IGraphics::ScreenWidth(pIVar5);
    pCVar4 = Screen(in_RDI);
    fVar6 = (float)iVar2 / pCVar4->w;
    pIVar5 = Graphics(in_RDI);
    iVar2 = IGraphics::ScreenHeight(pIVar5);
    pCVar4 = Screen(in_RDI);
    fVar7 = (float)iVar2 / pCVar4->h;
    pIVar5 = Graphics(in_RDI);
    (*(pIVar5->super_IInterface)._vptr_IInterface[3])
              (pIVar5,(ulong)(uint)(int)(pCVar3->x * fVar6),(ulong)(uint)(int)(pCVar3->y * fVar7),
               (ulong)(uint)(int)(pCVar3->w * fVar6),(ulong)(uint)(int)(pCVar3->h * fVar7));
  }
  else {
    pIVar5 = Graphics(in_RDI);
    (*(pIVar5->super_IInterface)._vptr_IInterface[4])();
  }
  return;
}

Assistant:

void CUI::UpdateClipping()
{
	if(IsClipped())
	{
		const CUIRect *pRect = ClipArea();
		const float XScale = Graphics()->ScreenWidth()/Screen()->w;
		const float YScale = Graphics()->ScreenHeight()/Screen()->h;
		Graphics()->ClipEnable((int)(pRect->x*XScale), (int)(pRect->y*YScale), (int)(pRect->w*XScale), (int)(pRect->h*YScale));
	}
	else
	{
		Graphics()->ClipDisable();
	}
}